

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_miner.cpp
# Opt level: O1

bool __thiscall
node::AncestorFeerateComparator::operator()
          (AncestorFeerateComparator *this,
          _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *a,
          _Rb_tree_iterator<std::pair<const_uint256,_node::MiniMinerMempoolEntry>_> *b)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = a->_M_node;
  iVar9 = *(int *)&p_Var2[2]._M_left;
  p_Var3 = *(_Base_ptr *)(p_Var2 + 3);
  p_Var4 = p_Var2[3]._M_parent;
  iVar13 = *(int *)&p_Var2[2]._M_right;
  uVar10 = (long)iVar13 * (long)p_Var3;
  lVar14 = SUB168(SEXT816((long)iVar13) * SEXT816((long)p_Var3),8);
  uVar11 = (long)iVar9 * (long)p_Var4;
  lVar15 = SUB168(SEXT816((long)iVar9) * SEXT816((long)p_Var4),8);
  uVar12 = (ulong)(uVar10 < uVar11);
  bVar7 = iVar13 < iVar9;
  if (uVar10 != uVar11 || lVar14 != lVar15) {
    bVar7 = (SBORROW8(lVar14,lVar15) != SBORROW8(lVar14 - lVar15,uVar12)) !=
            (long)((lVar14 - lVar15) - uVar12) < 0;
  }
  if (bVar7) {
    iVar13 = iVar9;
    p_Var4 = p_Var3;
  }
  p_Var5 = b->_M_node;
  iVar9 = *(int *)&p_Var5[2]._M_left;
  p_Var3 = *(_Base_ptr *)(p_Var5 + 3);
  p_Var6 = p_Var5[3]._M_parent;
  iVar16 = *(int *)&p_Var5[2]._M_right;
  uVar10 = (long)iVar16 * (long)p_Var3;
  lVar14 = SUB168(SEXT816((long)iVar16) * SEXT816((long)p_Var3),8);
  uVar11 = (long)iVar9 * (long)p_Var6;
  lVar15 = SUB168(SEXT816((long)iVar9) * SEXT816((long)p_Var6),8);
  uVar12 = (ulong)(uVar10 < uVar11);
  bVar7 = iVar16 < iVar9;
  if (uVar10 != uVar11 || lVar14 != lVar15) {
    bVar7 = (SBORROW8(lVar14,lVar15) != SBORROW8(lVar14 - lVar15,uVar12)) !=
            (long)((lVar14 - lVar15) - uVar12) < 0;
  }
  if (bVar7) {
    iVar16 = iVar9;
    p_Var6 = p_Var3;
  }
  if ((p_Var4 == p_Var6) && (iVar13 == iVar16)) {
    iVar9 = memcmp(p_Var2 + 1,p_Var5 + 1,0x20);
    bVar7 = SUB41((uint)iVar9 >> 0x1f,0);
  }
  else {
    uVar12 = (long)iVar16 * (long)p_Var4;
    lVar14 = SUB168(SEXT816((long)iVar16) * SEXT816((long)p_Var4),8);
    uVar10 = (long)p_Var6 * (long)iVar13;
    lVar15 = SUB168(SEXT816((long)p_Var6) * SEXT816((long)iVar13),8);
    if (uVar12 == uVar10 && lVar14 == lVar15) {
      bVar8 = -(iVar16 < iVar13) | 1;
      if (iVar13 == iVar16) {
        bVar8 = 0;
      }
    }
    else {
      uVar12 = (ulong)(uVar12 < uVar10);
      bVar8 = -((SBORROW8(lVar14,lVar15) != SBORROW8(lVar14 - lVar15,uVar12)) !=
               (long)((lVar14 - lVar15) - uVar12) < 0) | 1;
    }
    bVar7 = '\0' < (char)bVar8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const I& a, const I& b) const {
        auto min_feerate = [](const MiniMinerMempoolEntry& e) -> FeeFrac {
            FeeFrac self_feerate(e.GetModifiedFee(), e.GetTxSize());
            FeeFrac ancestor_feerate(e.GetModFeesWithAncestors(), e.GetSizeWithAncestors());
            return std::min(ancestor_feerate, self_feerate);
        };
        FeeFrac a_feerate{min_feerate(a->second)};
        FeeFrac b_feerate{min_feerate(b->second)};
        if (a_feerate != b_feerate) {
            return a_feerate > b_feerate;
        }
        // Use txid as tiebreaker for stable sorting
        return a->first < b->first;
    }